

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaAllocator_T::ImportVulkanFunctions(VmaAllocator_T *this,VmaVulkanFunctions *pVulkanFunctions)

{
  VmaAllocator_T *in_RSI;
  VmaAllocator_T *in_RDI;
  
  if (in_RSI != (VmaAllocator_T *)0x0) {
    ImportVulkanFunctions_Custom(in_RDI,(VmaVulkanFunctions *)in_RSI);
  }
  ImportVulkanFunctions_Dynamic(in_RSI);
  ValidateVulkanFunctions(in_RDI);
  return;
}

Assistant:

void VmaAllocator_T::ImportVulkanFunctions(const VmaVulkanFunctions* pVulkanFunctions)
{
#if VMA_STATIC_VULKAN_FUNCTIONS == 1
    ImportVulkanFunctions_Static();
#endif

    if(pVulkanFunctions != VMA_NULL)
    {
        ImportVulkanFunctions_Custom(pVulkanFunctions);
    }

#if VMA_DYNAMIC_VULKAN_FUNCTIONS == 1
    ImportVulkanFunctions_Dynamic();
#endif

    ValidateVulkanFunctions();
}